

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O2

Amount __thiscall cfd::FeeCalculator::GetFee(FeeCalculator *this,Utxo *utxo)

{
  uint32_t size;
  Amount AVar1;
  
  size = core::AbstractTransaction::GetVsizeFromSize
                   (utxo->uscript_size_max + 0x29,(uint)utxo->witness_size_max);
  AVar1 = GetFee(this,size);
  return AVar1;
}

Assistant:

Amount FeeCalculator::GetFee(const Utxo& utxo) const {
  uint32_t minimum_txin = static_cast<uint32_t>(TxIn::kMinimumTxInSize);
  uint32_t nowit_size = minimum_txin + utxo.uscript_size_max;
  uint32_t vsize =
      AbstractTransaction::GetVsizeFromSize(nowit_size, utxo.witness_size_max);
  return GetFee(vsize);
}